

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

Config * __thiscall QPDFJob::Config::compressStreams(Config *this,string *parameter)

{
  int iVar1;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  compress_streams_set = true;
  iVar1 = std::__cxx11::string::compare((char *)parameter);
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  compress_streams = iVar1 == 0;
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::compressStreams(std::string const& parameter)
{
    o.m->compress_streams_set = true;
    o.m->compress_streams = (parameter == "y");
    return this;
}